

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPTCPTransmitter::AddDestination(RTPTCPTransmitter *this,RTPAddress *addr)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int iVar5;
  SocketType s;
  int local_24;
  undefined4 local_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  
  iVar5 = -0xb5;
  if (((this->m_init == true) && (iVar5 = -0xbb, this->m_created == true)) &&
     (iVar5 = -0xbc, addr->addresstype == TCPAddress)) {
    local_24 = *(int *)&addr->field_0xc;
    if (local_24 == 0) {
      iVar5 = -0xbd;
    }
    else {
      p_Var1 = &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &p_Var1->_M_header;
      for (; p_Var4 != (_Base_ptr)0x0;
          p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < local_24]) {
        if (local_24 <= (int)p_Var4[1]._M_color) {
          p_Var3 = p_Var4;
        }
      }
      p_Var4 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         (p_Var4 = p_Var3, local_24 < (int)p_Var3[1]._M_color)) {
        p_Var4 = &p_Var1->_M_header;
      }
      iVar5 = -0xc2;
      if ((_Rb_tree_header *)p_Var4 == p_Var1) {
        iVar5 = 0;
        uStack_1c = 0;
        uStack_18 = 0;
        uStack_14 = 0;
        pmVar2 = std::
                 map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
                 ::operator[](&this->m_destSockets,&local_24);
        pmVar2->m_lengthBuffer[0] = (char)local_20;
        pmVar2->m_lengthBuffer[1] = (char)((uint)local_20 >> 8);
        *(short *)&pmVar2->field_0x2 = (short)((uint)local_20 >> 0x10);
        pmVar2->m_lengthBufferOffset = uStack_1c;
        pmVar2->m_dataLength = uStack_18;
        pmVar2->m_dataBufferOffset = uStack_14;
        pmVar2->m_pDataBuffer = (uint8_t *)0x0;
        RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
      }
    }
  }
  return iVar5;
}

Assistant:

int RTPTCPTransmitter::AddDestination(const RTPAddress &addr)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}

	if (addr.GetAddressType() != RTPAddress::TCPAddress)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_INVALIDADDRESSTYPE;
	}

	const RTPTCPAddress &a = static_cast<const RTPTCPAddress &>(addr);
	SocketType s = a.GetSocket();
	if (s == 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOSOCKETSPECIFIED;
	}

	int status = ValidateSocket(s);
	if (status != 0)
	{
		MAINMUTEX_UNLOCK
		return status;
	}
	
	std::map<SocketType, SocketData>::iterator it = m_destSockets.find(s);
	if (it != m_destSockets.end())
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SOCKETALREADYINDESTINATIONS;
	}
	m_destSockets[s] = SocketData();

	// Because the sockets are also used for incoming data, we'll abort a wait
	// that may be in progress, otherwise it could take a few seconds until the
	// new socket is monitored for incoming data
	m_pAbortDesc->SendAbortSignal();

	MAINMUTEX_UNLOCK
	return 0;
}